

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O3

void __thiscall
Assimp::ValidateDSProcess::DoValidationWithNameCheck<aiCamera>
          (ValidateDSProcess *this,aiCamera **array,uint size,char *firstName,char *secondName)

{
  char *pcVar1;
  aiCamera *paVar2;
  int iVar3;
  size_t sVar4;
  ValidateDSProcess *pVVar5;
  ulong uVar6;
  string name;
  ValidateDSProcess local_50;
  
  DoValidationEx<aiCamera>(this,array,size,firstName,secondName);
  if (size != 0) {
    uVar6 = 0;
    do {
      iVar3 = HasNameMatch(&array[uVar6]->mName,this->mScene->mRootNode);
      if (iVar3 != 1) {
        if (iVar3 == 0) {
          paVar2 = array[uVar6];
          pcVar1 = (paVar2->mName).data;
          local_50.super_BaseProcess._vptr_BaseProcess =
               (_func_int **)&local_50.super_BaseProcess.progress;
          sVar4 = strlen(pcVar1);
          pVVar5 = &local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)pVVar5,pcVar1,(paVar2->mName).data + sVar4);
          ReportError(pVVar5,"aiScene::%s[%i] has no corresponding node in the scene graph (%s)",
                      firstName,uVar6 & 0xffffffff,local_50.super_BaseProcess._vptr_BaseProcess);
        }
        paVar2 = array[uVar6];
        pcVar1 = (paVar2->mName).data;
        local_50.super_BaseProcess._vptr_BaseProcess =
             (_func_int **)&local_50.super_BaseProcess.progress;
        sVar4 = strlen(pcVar1);
        pVVar5 = &local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pVVar5,pcVar1,(paVar2->mName).data + sVar4);
        ReportError(pVVar5,"aiScene::%s[%i]: there are more than one nodes with %s as name",
                    firstName,uVar6 & 0xffffffff,local_50.super_BaseProcess._vptr_BaseProcess);
      }
      uVar6 = uVar6 + 1;
    } while (size != uVar6);
  }
  return;
}

Assistant:

inline
void ValidateDSProcess::DoValidationWithNameCheck(T** array, unsigned int size, const char* firstName,
        const char* secondName) {
    // validate all entries
    DoValidationEx(array,size,firstName,secondName);

    for (unsigned int i = 0; i < size;++i) {
        int res = HasNameMatch(array[i]->mName,mScene->mRootNode);
        if (0 == res)   {
            const std::string name = static_cast<char*>(array[i]->mName.data);
            ReportError("aiScene::%s[%i] has no corresponding node in the scene graph (%s)",
                firstName,i, name.c_str());
        } else if (1 != res)  {
            const std::string name = static_cast<char*>(array[i]->mName.data);
            ReportError("aiScene::%s[%i]: there are more than one nodes with %s as name",
                firstName,i, name.c_str());
        }
    }
}